

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

bool __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::erase
          (iterator *this,allocator_type *alloc,bool shouldRecomputeBounds)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  IntervalMap<unsigned_long,_std::monostate,_0U> *pIVar3;
  size_type sVar4;
  FreeNode *pFVar5;
  undefined8 uVar6;
  FreeNode *pFVar7;
  ulong uVar8;
  uint level;
  pointer pEVar9;
  uint32_t uVar10;
  uintptr_t intWord;
  uint uVar11;
  
  pIVar3 = (this->super_const_iterator).map;
  pEVar9 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar4 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar11 = pEVar9[sVar4 - 1].offset;
  level = pIVar3->height;
  if ((ulong)level == 0) {
    uVar10 = pIVar3->rootSize;
    if (uVar10 != uVar11 + 1) {
      do {
        uVar8 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
        puVar1 = (undefined8 *)((long)&pIVar3->field_0 + (ulong)uVar11 * 0x10);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pIVar3->field_0 + uVar8 * 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
      } while (uVar10 - 1 != uVar11);
      pEVar9 = (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      uVar11 = pIVar3->rootSize - 1;
    }
    pIVar3->rootSize = uVar11;
    pEVar9->size = uVar11;
    return false;
  }
  pFVar5 = (FreeNode *)pEVar9[sVar4 - 1].node;
  uVar10 = pEVar9[sVar4 - 1].size;
  if (uVar10 == 1) {
    pFVar5->next = alloc->freeList;
    alloc->freeList = pFVar5;
    eraseNode(this,level,alloc);
    return true;
  }
  if (uVar10 == uVar11 + 1) {
    pEVar9[level].size = uVar10 - 1;
  }
  else {
    do {
      uVar8 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
      pFVar7 = (pFVar5 + (ulong)uVar11 * 2)[1].next;
      pFVar5[uVar8 * 2].next = pFVar5[(ulong)uVar11 * 2].next;
      (pFVar5 + uVar8 * 2)[1].next = pFVar7;
    } while (uVar10 - 1 != uVar11);
    level = pIVar3->height;
    pEVar9 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar10 = pEVar9[(this->super_const_iterator).path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size;
    pEVar9[level].size = uVar10 - 1;
    if ((ulong)level == 0) {
      level = 0;
      goto LAB_0043c1f5;
    }
  }
  *(ulong *)((long)pEVar9[level - 1].node + (ulong)pEVar9[level - 1].offset * 8) =
       *(ulong *)((long)pEVar9[level - 1].node + (ulong)pEVar9[level - 1].offset * 8) &
       0xffffffffffffffc0 | (ulong)(uVar10 - 2);
LAB_0043c1f5:
  if (shouldRecomputeBounds) {
    recomputeBounds(this,level);
  }
  return false;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::erase(allocator_type& alloc,
                                                   bool shouldRecomputeBounds) {
    auto& map = *this->map;
    auto& path = this->path;
    SLANG_ASSERT(this->valid());

    uint32_t offset = path.leafOffset();
    if (this->isFlat()) {
        map.rootLeaf.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        return false;
    }

    // Nodes are not allowed to become empty, so erase the node itself
    // if that were to be the case.
    auto& node = path.template leaf<Leaf>();
    if (path.leafSize() == 1) {
        alloc.destroy(&node);
        eraseNode(map.height, alloc);
        return true;
    }

    // Otherwise just erase the current entry.
    node.erase(offset, offset + 1, path.leafSize());
    path.setSize(map.height, path.leafSize() - 1);

    if (shouldRecomputeBounds)
        recomputeBounds(map.height);

    return false;
}